

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O1

void __thiscall
bssl::gtest_suite_PkitsTest13NameConstraints_::
Section13ValidRFC822nameConstraintsTest25<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
::~Section13ValidRFC822nameConstraintsTest25
          (Section13ValidRFC822nameConstraintsTest25<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest13NameConstraints,
                     Section13ValidRFC822nameConstraintsTest25) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "nameConstraintsRFC822CA3Cert",
                               "ValidRFC822nameConstraintsTest25EE"};
  const char* const crls[] = {"TrustAnchorRootCRL",
                              "nameConstraintsRFC822CA3CRL"};
  PkitsTestInfo info;
  info.test_number = "4.13.25";
  info.should_validate = true;

  this->RunTest(certs, crls, info);
}